

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS
ref_collapse_edge_chord_height(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell_00;
  bool bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_INT local_18c;
  double local_188;
  double local_178;
  double local_170;
  double local_160;
  REF_INT local_154;
  int local_150;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL chord_ratio;
  REF_DBL chord;
  REF_DBL cross_length;
  REF_DBL new_length;
  REF_DBL cross_prod [3];
  double local_108;
  REF_DBL n1 [3];
  double local_e8;
  REF_DBL n0 [3];
  int local_c4;
  REF_INT i;
  REF_BOOL will_be_collapsed;
  REF_INT node;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  *allowed = 0;
  ref_cell_00 = ref_grid->cell[0];
  if ((node1 < 0) || (ref_cell_00->ref_adj->nnode <= node1)) {
    local_150 = -1;
  }
  else {
    local_150 = ref_cell_00->ref_adj->first[node1];
  }
  local_3c = local_150;
  if (local_150 == -1) {
    local_154 = -1;
  }
  else {
    local_154 = ref_cell_00->ref_adj->item[local_150].ref;
  }
  local_40 = local_154;
  while( true ) {
    if (local_3c == -1) {
      *allowed = 1;
      return 0;
    }
    uVar3 = ref_cell_nodes(ref_cell_00,local_40,&will_be_collapsed);
    if (uVar3 != 0) break;
    bVar2 = false;
    for (i = 0; i < ref_cell_00->node_per; i = i + 1) {
      if (node0 == (&will_be_collapsed)[i]) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      for (i = 0; i < ref_cell_00->node_per; i = i + 1) {
        if (node1 == (&will_be_collapsed)[i]) {
          for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
            n0[(long)local_c4 + -1] =
                 pRVar1->real[local_c4 + node1 * 0xf] - pRVar1->real[local_c4 + node0 * 0xf];
            n1[(long)local_c4 + -1] =
                 pRVar1->real[local_c4 + (&will_be_collapsed)[1 - i] * 0xf] -
                 pRVar1->real[local_c4 + node0 * 0xf];
          }
          dVar4 = sqrt(n1[1] * n1[1] + local_108 * local_108 + n1[0] * n1[0]);
          dVar5 = n0[0] * n1[1] + -(n0[1] * n1[0]);
          dVar6 = n0[1] * local_108 + -(local_e8 * n1[1]);
          dVar7 = local_e8 * n1[0] + -(n0[0] * local_108);
          dVar5 = sqrt(dVar7 * dVar7 + dVar5 * dVar5 + dVar6 * dVar6);
          if (dVar4 * 1e+20 <= 0.0) {
            local_160 = -(dVar4 * 1e+20);
          }
          else {
            local_160 = dVar4 * 1e+20;
          }
          local_170 = dVar5;
          if (dVar5 <= 0.0) {
            local_170 = -dVar5;
          }
          if (local_160 <= local_170) {
            return 0;
          }
          dVar5 = dVar5 / dVar4;
          if (dVar4 * 1e+20 <= 0.0) {
            local_178 = -(dVar4 * 1e+20);
          }
          else {
            local_178 = dVar4 * 1e+20;
          }
          local_188 = dVar5;
          if (dVar5 <= 0.0) {
            local_188 = -dVar5;
          }
          if (local_178 <= local_188) {
            return 0;
          }
          if (0.1 < dVar5 / dVar4) {
            return 0;
          }
        }
      }
    }
    local_3c = ref_cell_00->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_18c = -1;
    }
    else {
      local_18c = ref_cell_00->ref_adj->item[local_3c].ref;
    }
    local_40 = local_18c;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x25a,
         "ref_collapse_edge_chord_height",(ulong)uVar3,"nodes");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_chord_height(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_INT i;
  REF_DBL n0[3], n1[3], cross_prod[3];
  REF_DBL new_length, cross_length, chord, chord_ratio;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_edg(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        /* triangle node0, node1, nodes[node] */
        /* nodes[node] = node0; */
        for (i = 0; i < 3; i++) {
          n0[i] = ref_node_xyz(ref_node, i, node1) -
                  ref_node_xyz(ref_node, i, node0);
          n1[i] = ref_node_xyz(ref_node, i, nodes[1 - node]) -
                  ref_node_xyz(ref_node, i, node0);
        }
        new_length = sqrt(ref_math_dot(n1, n1));
        ref_math_cross_product(n0, n1, cross_prod);
        cross_length = sqrt(ref_math_dot(cross_prod, cross_prod));
        /* |n0 x n1| = |n0||n1|sin(t) */
        if (ref_math_divisible(cross_length, new_length)) {
          chord = cross_length / new_length;
          if (ref_math_divisible(chord, new_length)) {
            chord_ratio = chord / new_length;
            if (chord_ratio > 0.1) return REF_SUCCESS;
          } else {
            return REF_SUCCESS;
          }
        } else {
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}